

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O2

void __thiscall xLearn::MODEL_TEST_Init_fm_Test::TestBody(MODEL_TEST_Init_fm_Test *this)

{
  real_t *prVar1;
  index_t i;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  index_t j;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 in_XMM2 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  AssertHelper local_308;
  AssertionResult gtest_ar;
  index_t param_num_v;
  uint local_2e8;
  index_t param_num_w;
  real_t *local_2e0;
  real_t *local_2d8;
  Model model_fm;
  HyperParam hyper_param;
  
  Init();
  std::__cxx11::string::assign((char *)&hyper_param.score_func);
  model_fm.score_func_._M_dataplus._M_p = (pointer)&model_fm.score_func_.field_2;
  model_fm.score_func_._M_string_length = 0;
  model_fm.score_func_.field_2._M_local_buf[0] = '\0';
  model_fm.loss_func_._M_dataplus._M_p = (pointer)&model_fm.loss_func_.field_2;
  model_fm.loss_func_._M_string_length = 0;
  model_fm.loss_func_.field_2._M_local_buf[0] = '\0';
  model_fm.param_w_ = (real_t *)0x0;
  model_fm.param_v_ = (real_t *)0x0;
  model_fm.param_b_ = (real_t *)0x0;
  model_fm.param_best_w_ = (real_t *)0x0;
  model_fm.param_best_v_ = (real_t *)0x0;
  model_fm.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&model_fm,&hyper_param.score_func,&hyper_param.loss_func,hyper_param.num_feature
                    ,hyper_param.num_field,hyper_param.num_K,hyper_param.auxiliary_size,0.5);
  prVar1 = model_fm.param_b_;
  param_num_w = hyper_param.num_feature * 2;
  local_2e0 = model_fm.param_w_;
  local_2d8 = model_fm.param_v_;
  param_num_v = param_num_w * hyper_param.num_K;
  local_310.ptr_._0_4_ = model_fm.param_num_w_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"param_num_w","model_fm.GetNumParameter_w()",&param_num_w,
             (uint *)&local_310);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_310);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_310);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_310.ptr_._0_4_ = model_fm.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"param_num_v","model_fm.GetNumParameter_v()",&param_num_v,
             (uint *)&local_310);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_310);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,100,pcVar5);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_310);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_310.ptr_._0_4_ = param_num_v + 2 + param_num_w;
  local_308.data_._0_4_ = model_fm.param_num_w_ + 2 + model_fm.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"param_num_v+param_num_w+2","model_fm.GetNumParameter()",
             (uint *)&local_310,(uint *)&local_308);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_310);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x65,pcVar5);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_310);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>((internal *)&gtest_ar,"b[0]","0",*prVar1,0.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_310);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x66,pcVar5);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_310);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"b[1]","1.0",prVar1[1],1.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_310);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x67,pcVar5);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_310);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2e8 = model_fm.param_num_w_;
  for (uVar4 = 0; (uint)uVar4 < local_2e8; uVar4 = uVar4 + hyper_param.auxiliary_size) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"w[i]","0.0",local_2e0[uVar4 & 0xffffffff],0.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_310);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
                 ,0x6b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_308);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_310);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    for (uVar6 = 1; uVar6 < hyper_param.auxiliary_size; uVar6 = uVar6 + 1) {
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"w[i+j]","1.0",local_2e0[(uint)uVar4 + (int)uVar6],1.0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_310);
        pcVar5 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_308,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x6d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_310);
        testing::internal::AssertHelper::~AssertHelper(&local_308);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_310);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  auVar7 = vcvtusi2ss_avx512f(in_XMM2,model_fm.num_K_);
  auVar7 = ZEXT416((uint)(auVar7._0_4_ * 0.25));
  auVar7 = vroundss_avx(auVar7,auVar7,10);
  iVar2 = vcvttss2usi_avx512f(auVar7);
  uVar3 = iVar2 * 4;
  iVar2 = hyper_param.auxiliary_size * uVar3;
  for (; uVar3 < param_num_v; uVar3 = uVar3 + iVar2) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"v[i]","1.0",local_2d8[uVar3],1.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_310);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
                 ,0x72,pcVar5);
      testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_308);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_310);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  Model::~Model(&model_fm);
  HyperParam::~HyperParam(&hyper_param);
  return;
}

Assistant:

TEST(MODEL_TEST, Init_fm) {
  HyperParam hyper_param = Init();
  hyper_param.score_func = "fm";
  Model model_fm;
  model_fm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 
                    hyper_param.auxiliary_size, 
                    0.5);
  real_t* b = model_fm.GetParameter_b();
  real_t* w = model_fm.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_fm.GetParameter_v();
  index_t param_num_v = hyper_param.num_feature *
                        hyper_param.num_K * 2;
  EXPECT_EQ(param_num_w, model_fm.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_fm.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_fm.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t len = model_fm.GetNumParameter_w();
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < len; i+=aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }
  }
  index_t k_aligned = model_fm.get_aligned_k();
  for (index_t i = k_aligned; i < param_num_v; i+=(aux_size*k_aligned)) {
    EXPECT_FLOAT_EQ(v[i], 1.0);
  }
}